

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O3

uint64 crnlib::dxt_fast::determine_error
                 (uint n,color_quad_u8 *block,uint min16,uint max16,uint64 early_out_error)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int i;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  bool bVar12;
  byte local_68 [32];
  int local_48 [6];
  int stops [4];
  
  local_68[0] = ryg_dxt::Expand5[min16 >> 0xb & 0x1f];
  local_68[1] = ryg_dxt::Expand6[min16 >> 5 & 0x3f];
  local_68[2] = ryg_dxt::Expand5[min16 & 0x1f];
  local_68[4] = ryg_dxt::Expand5[max16 >> 0xb & 0x1f];
  local_68[5] = ryg_dxt::Expand6[max16 >> 5 & 0x3f];
  local_68[6] = ryg_dxt::Expand5[max16 & 0x1f];
  local_68[8] = (char)(((uint)local_68[4] + (uint)local_68[0] * 2) / 3);
  local_68[9] = (char)(((uint)local_68[5] + (uint)local_68[1] * 2) / 3);
  local_68[10] = (char)(((uint)local_68[6] + (uint)local_68[2] * 2) / 3);
  local_68[0xc] = (char)(((uint)local_68[0] + (uint)local_68[4] * 2) / 3);
  local_68[0xd] = (char)(((uint)local_68[1] + (uint)local_68[5] * 2) / 3);
  local_68[0xe] = (char)(((uint)local_68[2] + (uint)local_68[6] * 2) / 3);
  lVar4 = 0;
  do {
    local_48[lVar4] =
         (uint)*(byte *)((long)local_48 + lVar4 * 4 + -0x1e) *
         ((uint)local_68[2] - (uint)local_68[6]) +
         (uint)*(byte *)((long)local_48 + lVar4 * 4 + -0x1f) *
         ((uint)local_68[1] - (uint)local_68[5]) +
         (uint)*(byte *)(local_48 + lVar4 + -8) * ((uint)local_68[0] - (uint)local_68[4]);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  if (n == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    lVar4 = 0;
    do {
      if (min16 == max16) {
        uVar11 = (uint)block[lVar4].field_0.field_0.r;
        uVar7 = (uint)block[lVar4].field_0.field_0.g;
        uVar9 = (uint)block[lVar4].field_0.field_0.b;
        uVar6 = 0;
      }
      else {
        bVar1 = block[lVar4].field_0.field_0.r;
        uVar11 = (uint)bVar1;
        bVar2 = block[lVar4].field_0.field_0.g;
        uVar7 = (uint)bVar2;
        bVar3 = block[lVar4].field_0.field_0.b;
        uVar9 = (uint)bVar3;
        iVar8 = ((uint)local_68[2] - (uint)local_68[6]) * (uint)bVar3 +
                ((uint)local_68[1] - (uint)local_68[5]) * (uint)bVar2 +
                ((uint)local_68[0] - (uint)local_68[4]) * (uint)bVar1;
        uVar6 = (ulong)((uint)(iVar8 < local_48[2] + local_48[0] >> 1) * 2);
        if (iVar8 < local_48[3] + local_48[2] >> 1) {
          uVar6 = (ulong)(local_48[1] + local_48[3] >> 1 <= iVar8) * 2 + 1;
        }
      }
      iVar8 = uVar7 - *(byte *)((long)local_48 + uVar6 * 4 + -0x1f);
      iVar10 = uVar9 - *(byte *)((long)local_48 + uVar6 * 4 + -0x1e);
      uVar5 = (ulong)(uint)(iVar10 * iVar10) + (ulong)(uint)(iVar8 * iVar8) +
              uVar5 + (uVar11 - *(byte *)(local_48 + (uVar6 - 8))) *
                      (uVar11 - *(byte *)(local_48 + (uVar6 - 8)));
    } while ((uVar5 < early_out_error) &&
            (bVar12 = (ulong)n - 1 != lVar4, lVar4 = lVar4 + 1, bVar12));
  }
  return uVar5;
}

Assistant:

static uint64 determine_error(uint n, const color_quad_u8* block, uint min16, uint max16, uint64 early_out_error)
        {
            color_quad_u8 color[4];

            eval_colors(color, min16, max16);

            int dirr = color[0].r - color[1].r;
            int dirg = color[0].g - color[1].g;
            int dirb = color[0].b - color[1].b;

            int stops[4];
            for (int i = 0; i < 4; i++)
            {
                stops[i] = color[i].r * dirr + color[i].g * dirg + color[i].b * dirb;
            }

            // 0 2 3 1
            int c0Point = stops[1] + stops[3];
            int halfPoint = stops[3] + stops[2];
            int c3Point = stops[2] + stops[0];

            c0Point >>= 1;
            halfPoint >>= 1;
            c3Point >>= 1;

            uint64 total_error = 0;

            for (uint i = 0; i < n; i++)
            {
                const color_quad_u8& a = block[i];

                uint s = 0;
                if (min16 != max16)
                {
                    int dot = a.r * dirr + a.g * dirg + a.b * dirb;

                    if (dot < halfPoint)
                    {
                        s = (dot < c0Point) ? 1 : 3;
                    }
                    else
                    {
                        s = (dot < c3Point) ? 2 : 0;
                    }
                }

                const color_quad_u8& b = color[s];

                int e = a[0] - b[0];
                total_error += e * e;

                e = a[1] - b[1];
                total_error += e * e;

                e = a[2] - b[2];
                total_error += e * e;

                if (total_error >= early_out_error)
                {
                    break;
                }
            }

            return total_error;
        }